

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_noCompressLiterals(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(((0x1f < srcSize) + 1) - (uint)(srcSize < 0x1000));
  uVar2 = uVar4 + srcSize + 1;
  sVar1 = 0xffffffffffffffba;
  if (uVar2 <= dstCapacity) {
    lVar5 = uVar4 + 1;
    iVar3 = (int)lVar5;
    if (iVar3 == 3) {
      *(uint *)dst = (int)srcSize << 4 | 0xc;
    }
    else if (iVar3 == 2) {
      *(ushort *)dst = (ushort)((int)srcSize << 4) | 4;
    }
    else {
      *(char *)dst = (char)srcSize * '\b';
    }
    memcpy((void *)((long)dst + lVar5),src,srcSize);
    sVar1 = uVar2;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_noCompressLiterals (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE* const)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    RETURN_ERROR_IF(srcSize + flSize > dstCapacity, dstSize_tooSmall);

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_basic + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_basic + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_basic + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    memcpy(ostart + flSize, src, srcSize);
    return srcSize + flSize;
}